

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallFilesCommand.cxx
# Opt level: O1

string * __thiscall
cmInstallFilesCommand::FindInstallSource_abi_cxx11_
          (string *__return_storage_ptr__,cmInstallFilesCommand *this,char *name)

{
  bool bVar1;
  size_type sVar2;
  char *pcVar3;
  size_type *psVar4;
  size_type *psVar5;
  bool bVar6;
  string ts;
  allocator local_8a;
  allocator local_89;
  _Alloc_hider local_88;
  size_type local_80;
  size_type local_78;
  undefined8 uStack_70;
  _Alloc_hider local_68;
  size_type local_60;
  size_type local_58;
  undefined8 uStack_50;
  string local_48;
  
  bVar1 = cmsys::SystemTools::FileIsFullPath(name);
  bVar6 = true;
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_48,name,&local_89);
    sVar2 = cmGeneratorExpression::Find(&local_48);
    bVar6 = sVar2 == 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  if (bVar6) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,name,(allocator *)&local_88);
    return __return_storage_ptr__;
  }
  pcVar3 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
  std::__cxx11::string::string((string *)&local_88,pcVar3,(allocator *)&local_68);
  std::__cxx11::string::append((char *)&local_88);
  std::__cxx11::string::append((char *)&local_88);
  pcVar3 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
  std::__cxx11::string::string((string *)&local_68,pcVar3,&local_8a);
  std::__cxx11::string::append((char *)&local_68);
  std::__cxx11::string::append((char *)&local_68);
  bVar6 = cmsys::SystemTools::FileExists(local_88._M_p);
  if (bVar6) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  }
  else {
    bVar6 = cmsys::SystemTools::FileExists(local_68._M_p);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (bVar6) {
      psVar4 = &local_58;
      if ((size_type *)local_68._M_p == psVar4) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity = local_58;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_50;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_68._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = local_58;
      }
      psVar5 = &local_60;
      goto LAB_003e3889;
    }
  }
  psVar4 = &local_78;
  if ((size_type *)local_88._M_p == psVar4) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_78;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_70;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_88._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_78;
  }
  psVar5 = &local_80;
LAB_003e3889:
  __return_storage_ptr__->_M_string_length = *psVar5;
  psVar5[-1] = (size_type)psVar4;
  *psVar5 = 0;
  *(undefined1 *)psVar4 = 0;
  if ((size_type *)local_68._M_p != &local_58) {
    operator_delete(local_68._M_p,local_58 + 1);
  }
  if ((size_type *)local_88._M_p != &local_78) {
    operator_delete(local_88._M_p,local_78 + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallFilesCommand::FindInstallSource(const char* name) const
{
  if(cmSystemTools::FileIsFullPath(name) ||
     cmGeneratorExpression::Find(name) == 0)
    {
    // This is a full path.
    return name;
    }

  // This is a relative path.
  std::string tb = this->Makefile->GetCurrentBinaryDirectory();
  tb += "/";
  tb += name;
  std::string ts = this->Makefile->GetCurrentSourceDirectory();
  ts += "/";
  ts += name;

  if(cmSystemTools::FileExists(tb.c_str()))
    {
    // The file exists in the binary tree.  Use it.
    return tb;
    }
  else if(cmSystemTools::FileExists(ts.c_str()))
    {
    // The file exists in the source tree.  Use it.
    return ts;
    }
  else
    {
    // The file doesn't exist.  Assume it will be present in the
    // binary tree when the install occurs.
    return tb;
    }
}